

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

float_t __thiscall djb::microfacet::sigma(microfacet *this,vec3 *wi,args *args)

{
  float fVar1;
  float extraout_XMM0_Da;
  vec3 vVar2;
  
  vVar2 = djb::operator*(&args->minv,wi);
  fVar1 = vVar2.z * vVar2.z + vVar2.x * vVar2.x + vVar2.y * vVar2.y;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  (*(this->super_brdf)._vptr_brdf[10])(this);
  return extraout_XMM0_Da * fVar1;
}

Assistant:

float_t microfacet::sigma(const vec3 &wi, const args &args) const
{
	vec3 wi_std = args.minv * wi;
	float_t nrm = sqrt(dot(wi_std, wi_std));
	return sigma_std(wi_std / nrm) * nrm;
}